

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

int Cof_ManCountRemoved(Cof_Man_t *p,Cof_Obj_t *pRoot,int fConst1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Cof_Obj_t *pObj;
  Cof_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  bool bVar4;
  int local_68;
  int iNextNew;
  int iLit1;
  int iLit0;
  int iHandle;
  int k;
  int i;
  int LevelNext;
  int LevelStart;
  int Counter;
  Cof_Obj_t *pFanin1;
  Cof_Obj_t *pFanin0;
  Cof_Obj_t *pNext;
  Cof_Obj_t *pTemp;
  Gia_Obj_t *pNextGia;
  int fConst1_local;
  Cof_Obj_t *pRoot_local;
  Cof_Man_t *p_local;
  
  LevelNext = 0;
  Cof_ManIncrementTravId(p);
  Cof_ObjSetTravIdCurrent(p,pRoot);
  iHandle = Cof_ObjLevel(p,pRoot);
  if (p->pLevels[iHandle] != 0) {
    __assert_fail("p->pLevels[LevelStart] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCof.c"
                  ,0x1c8,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
  }
  pRoot->iNext = 0;
  uVar1 = Cof_ObjHandle(p,pRoot);
  p->pLevels[iHandle] = uVar1;
  iVar2 = Abc_Var2Lit(0,fConst1);
  pRoot->iLit = iVar2;
  do {
    if (p->nLevels <= iHandle) {
      return LevelNext;
    }
    iLit1 = p->pLevels[iHandle];
    while( true ) {
      bVar4 = false;
      if (iLit1 != 0) {
        pNext = Cof_ManObj(p,iLit1);
        bVar4 = pNext != (Cof_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar2 = pNext->Id;
      iVar3 = Abc_Lit2Var(pNext->iLit);
      if (iVar2 == iVar3) {
        __assert_fail("pTemp->Id != Abc_Lit2Var(pTemp->iLit)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCof.c"
                      ,0x1d4,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
      }
      iLit0 = 0;
      while( true ) {
        bVar4 = false;
        if (iLit0 < (int)(*(uint *)pNext >> 8)) {
          pFanin0 = Cof_ObjFanout(pNext,iLit0);
          bVar4 = pFanin0 != (Cof_Obj_t *)0x0;
        }
        if (!bVar4) break;
        iVar2 = Cof_ObjIsCo(pFanin0);
        if ((iVar2 == 0) && (iVar2 = Cof_ObjIsTravIdCurrent(p,pFanin0), iVar2 == 0)) {
          pObj = Cof_ObjFanin(pFanin0,0);
          pObj_00 = Cof_ObjFanin(pFanin0,1);
          if ((pObj != pNext) && (pObj_00 != pNext)) {
            __assert_fail("pFanin0 == pTemp || pFanin1 == pTemp",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCof.c"
                          ,0x1dd,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
          }
          pObj_01 = Gia_ManObj(p->pGia,pFanin0->Id);
          iVar2 = Cof_ObjIsTravIdCurrent(p,pObj);
          if (iVar2 == 0) {
            iNextNew = Gia_ObjFaninLit0(pObj_01,pFanin0->Id);
          }
          else {
            iVar2 = pObj->iLit;
            iVar3 = Gia_ObjFaninC0(pObj_01);
            iNextNew = Abc_LitNotCond(iVar2,iVar3);
          }
          iVar2 = Cof_ObjIsTravIdCurrent(p,pObj_00);
          if (iVar2 == 0) {
            local_68 = Gia_ObjFaninLit1(pObj_01,pFanin0->Id);
          }
          else {
            iVar2 = pObj_00->iLit;
            iVar3 = Gia_ObjFaninC1(pObj_01);
            local_68 = Abc_LitNotCond(iVar2,iVar3);
          }
          iVar2 = Gia_ManHashAndTry(p->pGia,iNextNew,local_68);
          if (iVar2 != -1) {
            Cof_ObjSetTravIdCurrent(p,pFanin0);
            pFanin0->iLit = iVar2;
            iVar2 = Cof_ObjLevel(p,pFanin0);
            if ((iVar2 <= iHandle) || (p->nLevels <= iVar2)) {
              __assert_fail("LevelNext > i && LevelNext < p->nLevels",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCof.c"
                            ,0x1ef,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
            }
            pFanin0->iNext = p->pLevels[iVar2];
            uVar1 = Cof_ObjHandle(p,pFanin0);
            p->pLevels[iVar2] = uVar1;
            LevelNext = LevelNext + 1;
          }
        }
        iLit0 = iLit0 + 1;
      }
      iLit1 = pNext->iNext;
    }
    p->pLevels[iHandle] = 0;
    iHandle = iHandle + 1;
  } while( true );
}

Assistant:

int Cof_ManCountRemoved( Cof_Man_t * p, Cof_Obj_t * pRoot, int fConst1 )
{
    Gia_Obj_t * pNextGia;
    Cof_Obj_t * pTemp, * pNext, * pFanin0, * pFanin1;
    int Counter = 0, LevelStart, LevelNext;
    int i, k, iHandle, iLit0, iLit1, iNextNew;
    // restart the trav ids
    Cof_ManIncrementTravId( p );
    Cof_ObjSetTravIdCurrent( p, pRoot );
    // add the node to the queue
    LevelStart = Cof_ObjLevel(p, pRoot);
    assert( p->pLevels[LevelStart] == 0 );
    pRoot->iNext = 0;
    p->pLevels[LevelStart] = Cof_ObjHandle( p, pRoot );
    // set the new literal
    pRoot->iLit = Abc_Var2Lit( 0, fConst1 );
    // process nodes in the levelized order
    for ( i = LevelStart; i < p->nLevels; i++ )
    {
        for ( iHandle = p->pLevels[i]; 
              iHandle && (pTemp = Cof_ManObj(p, iHandle)); 
              iHandle = pTemp->iNext )
        {
            assert( pTemp->Id != Abc_Lit2Var(pTemp->iLit) );
            Cof_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( Cof_ObjIsCo(pNext) )
                    continue;
                if ( Cof_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                pFanin0 = Cof_ObjFanin( pNext, 0 );
                pFanin1 = Cof_ObjFanin( pNext, 1 );
                assert( pFanin0 == pTemp || pFanin1 == pTemp );
                pNextGia = Gia_ManObj( p->pGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin0) )
                    iLit0 = Abc_LitNotCond( pFanin0->iLit, Gia_ObjFaninC0(pNextGia) );
                else
                    iLit0 = Gia_ObjFaninLit0( pNextGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin1) )
                    iLit1 = Abc_LitNotCond( pFanin1->iLit, Gia_ObjFaninC1(pNextGia) );
                else
                    iLit1 = Gia_ObjFaninLit1( pNextGia, pNext->Id );
                iNextNew = Gia_ManHashAndTry( p->pGia, iLit0, iLit1 );
                if ( iNextNew == -1 )
                    continue;
                Cof_ObjSetTravIdCurrent(p, pNext);
                // set the new literal
                pNext->iLit = iNextNew;
                // add it to be processed
                LevelNext = Cof_ObjLevel( p, pNext );
                assert( LevelNext > i && LevelNext < p->nLevels );
                pNext->iNext = p->pLevels[LevelNext];
                p->pLevels[LevelNext] = Cof_ObjHandle( p, pNext );
                Counter++;
            }
        }
        p->pLevels[i] = 0;
    }
    return Counter;
}